

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O3

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
postfixExpression(Tokenizer *tokenizer)

{
  char *pcVar1;
  long lVar2;
  int64_t value;
  Token *pTVar3;
  ExpressionFunctionHandler *this;
  Token *pTVar4;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> tVar5;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> extraout_RAX;
  _Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> extraout_RAX_00;
  ExpressionInternal *extraout_RAX_01;
  _Head_base<0UL,_ExpressionInternal_*,_false> _Var6;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> extraout_RAX_02;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> extraout_RAX_03;
  __uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> _Var7;
  tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_> extraout_RAX_04;
  ExpressionInternal *pEVar8;
  __uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
  extraout_RAX_05;
  Tokenizer *in_RSI;
  size_type __rlen;
  optional<ExpressionFunctionHandle> oVar9;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  parameters;
  undefined1 local_68 [32];
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  local_48;
  undefined8 local_30;
  
  pTVar3 = Tokenizer::peekToken(in_RSI,0);
  if ((pTVar3->type == Identifier) &&
     (pTVar3 = Tokenizer::peekToken(in_RSI,1), pTVar3->type == LParen)) {
    this = ExpressionFunctionHandler::instance();
    pTVar3 = Tokenizer::peekToken(in_RSI,0);
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') goto LAB_001452bf;
    oVar9 = ExpressionFunctionHandler::find(this,(Identifier *)&pTVar3->value);
    if (((undefined1  [16])
         oVar9.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
         super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      pTVar3 = Tokenizer::nextToken(in_RSI);
      if (*(__index_type *)
           ((long)&(pTVar3->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) == '\x04') {
        Tokenizer::eatTokens(in_RSI,1);
        local_48.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do {
          pTVar4 = Tokenizer::peekToken(in_RSI,0);
          if (pTVar4->type == RParen) {
            Tokenizer::eatTokens(in_RSI,1);
            pEVar8 = (ExpressionInternal *)operator_new(0x50);
            local_68._0_8_ =
                 local_48.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_68._8_8_ =
                 local_48.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_68._16_8_ =
                 local_48.
                 super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_48.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ExpressionInternal::ExpressionInternal
                      (pEVar8,(Identifier *)&pTVar3->value,
                       (vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                        *)local_68);
            (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)pEVar8;
            std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::~vector((vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
                       *)local_68);
LAB_001452a7:
            std::
            vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
            ::~vector(&local_48);
            return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
                    )extraout_RAX_05.
                     super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
                     .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
          }
          if ((local_48.
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_48.
               super__Vector_base<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) &&
             (pTVar4 = Tokenizer::nextToken(in_RSI), pTVar4->type != Comma)) {
            (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)0x0;
            goto LAB_001452a7;
          }
          expression((Tokenizer *)local_68);
          if ((ExpressionInternal *)local_68._0_8_ == (ExpressionInternal *)0x0) {
            (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)0x0;
            std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::
            ~unique_ptr((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                        local_68);
            goto LAB_001452a7;
          }
          std::
          vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
          ::
          emplace_back<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                    ((vector<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::allocator<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>>
                      *)&local_48,
                     (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     local_68);
          std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                    ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                     local_68);
        } while( true );
      }
      goto LAB_001452bf;
    }
  }
  pTVar3 = Tokenizer::peekToken(in_RSI,0);
  tVar5.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._0_4_ = pTVar3->type - Identifier;
  tVar5.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
  super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl._4_4_ = 0;
  switch(tVar5.
         super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
         super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl) {
  case (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0:
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
LAB_001452bf:
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    Tokenizer::eatTokens(in_RSI,1);
    pcVar1 = *(char **)&(pTVar3->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        ._M_u;
    lVar2 = *(long *)((long)&(pTVar3->value).
                             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     + 8);
    if ((lVar2 == 1) && (*pcVar1 == '.')) {
      tVar5.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
           operator_new(0x50);
      *(undefined4 *)
       tVar5.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
       super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl = 5;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
              .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
              .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
              .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl + 0x18) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
              .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl + 0x40) = 0;
      (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
      super__List_node_base._M_next =
           (_List_node_base *)
           tVar5.
           super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
           super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
      return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
              )tVar5.
               super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
               .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
    }
    pEVar8 = (ExpressionInternal *)operator_new(0x50);
    local_68._0_8_ = (long)local_68 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,pcVar1,pcVar1 + lVar2);
    ExpressionInternal::ExpressionInternal(pEVar8,(Identifier *)local_68);
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pEVar8;
    if (local_68._0_8_ == (long)local_68 + 0x10) {
      return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
              )extraout_RAX_02.
               super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
               .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
    }
    break;
  case (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x1:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x01') {
      __assert_fail("std::holds_alternative<int64_t>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x59,"int64_t Token::intValue() const");
    }
    value = *(int64_t *)
             &(pTVar3->value).
              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
              _M_u;
    pEVar8 = (ExpressionInternal *)operator_new(0x50);
    ExpressionInternal::ExpressionInternal(pEVar8,value);
    _Var6._M_head_impl = extraout_RAX_01;
    goto LAB_001451c1;
  case (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x2:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x03') {
      __assert_fail("std::holds_alternative<StringLiteral>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x53,"const StringLiteral &Token::stringValue() const");
    }
    pEVar8 = (ExpressionInternal *)operator_new(0x50);
    lVar2 = *(long *)&(pTVar3->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    local_68._0_8_ = (long)local_68 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,lVar2,
               *(long *)((long)&(pTVar3->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) + lVar2);
    ExpressionInternal::ExpressionInternal(pEVar8,(StringLiteral *)local_68);
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pEVar8;
    if (local_68._0_8_ == (long)local_68 + 0x10) {
      return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
              )extraout_RAX.
               super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>
               .super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
    }
    break;
  case (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x3:
    Tokenizer::eatTokens(in_RSI,1);
    if (*(__index_type *)
         ((long)&(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x02') {
      __assert_fail("std::holds_alternative<double>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x5f,"double Token::floatValue() const");
    }
    local_30 = *(undefined8 *)
                &(pTVar3->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                 ._M_u;
    pEVar8 = (ExpressionInternal *)operator_new(0x50);
    ExpressionInternal::ExpressionInternal(pEVar8,(double)local_30);
    _Var6 = extraout_RAX_00.super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
LAB_001451c1:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)pEVar8;
    return (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>)
           _Var6._M_head_impl;
  case (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x4:
    Tokenizer::eatTokens(in_RSI,1);
    expression((Tokenizer *)local_68);
    pTVar3 = Tokenizer::nextToken(in_RSI);
    _Var7._M_t.
    super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
    super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
         (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
         (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_68._0_8_;
    if (pTVar3->type == RParen) {
      local_68._0_8_ = (ExpressionInternal *)0x0;
    }
    else {
      _Var7._M_t.
      super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
      super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
           (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
           (_Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)0x0;
    }
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next =
         (_List_node_base *)
         _Var7._M_t.
         super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
         super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_68)
    ;
    return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
           )extraout_RAX_04.
            super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
            super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
  default:
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>
           )tVar5.
            super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
            super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
  }
  operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)
         extraout_RAX_03.
         super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
         super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<ExpressionInternal> postfixExpression(Tokenizer& tokenizer)
{
	if (tokenizer.peekToken(0).type == TokenType::Identifier &&
		tokenizer.peekToken(1).type == TokenType::LParen &&
		ExpressionFunctionHandler::instance().find(tokenizer.peekToken(0).identifierValue()))
	{
		const Identifier &functionName = tokenizer.nextToken().identifierValue();
		tokenizer.eatToken();

		std::vector<std::unique_ptr<ExpressionInternal>> parameters;
		while (tokenizer.peekToken().type != TokenType::RParen)
		{
			if (parameters.size() != 0 && tokenizer.nextToken().type != TokenType::Comma)
				return nullptr;

			std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
			if (exp == nullptr)
				return nullptr;

			parameters.push_back(std::move(exp));
		}

		tokenizer.eatToken();

		return std::make_unique<ExpressionInternal>(functionName, std::move(parameters));
	}

	return primaryExpression(tokenizer);
}